

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_cop1_ldst(DisasContext_conflict6 *ctx,uint32_t op,int rt,int rs,int16_t imm)

{
  TCGContext_conflict6 *tcg_ctx;
  TCGv_i64 addr;
  uintptr_t o;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  addr = tcg_temp_new_i64(tcg_ctx);
  if ((ctx->CP0_Config1 & 1) == 0) {
    generate_exception_err(ctx,0x13,1);
  }
  else {
    check_cp1_enabled(ctx);
    if ((op | 0x20000000) == 0xf4000000) {
      check_insn(ctx,2);
    }
    gen_base_offset_addr(ctx,addr,rs,(int)imm);
    gen_flt_ldst(ctx,op,rt,addr);
  }
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(addr + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_cop1_ldst(DisasContext *ctx, uint32_t op, int rt,
                          int rs, int16_t imm)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0 = tcg_temp_new(tcg_ctx);

    if (ctx->CP0_Config1 & (1 << CP0C1_FP)) {
        check_cp1_enabled(ctx);
        switch (op) {
        case OPC_LDC1:
        case OPC_SDC1:
            check_insn(ctx, ISA_MIPS2);
            /* Fallthrough */
        default:
            gen_base_offset_addr(ctx, t0, rs, imm);
            gen_flt_ldst(ctx, op, rt, t0);
        }
    } else {
        generate_exception_err(ctx, EXCP_CpU, 1);
    }
    tcg_temp_free(tcg_ctx, t0);
}